

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

int MatchFinder_Create(CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,
                      UInt32 matchMaxLen,UInt32 keepAddBufferAfter,ISzAlloc *alloc)

{
  Byte *pBVar1;
  CLzRef *pCVar2;
  sbyte sVar3;
  UInt32 UVar4;
  int iVar5;
  uint uVar6;
  UInt32 UVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  
  if (historySize < 0xe0000001) {
    sVar3 = 3;
    if (historySize < 0xc0000000) {
      sVar3 = 1 - (char)((int)historySize >> 0x1f);
    }
    UVar7 = keepAddBufferAfter + matchMaxLen;
    UVar4 = keepAddBufferBefore + historySize + 1;
    p->keepSizeBefore = UVar4;
    p->keepSizeAfter = UVar7;
    uVar8 = (UVar7 + keepAddBufferBefore >> 1) + UVar7 + UVar4 + (historySize >> sVar3) + 0x80000;
    if (p->directInput == '\0') {
      if ((p->bufferBase == (Byte *)0x0) || (p->blockSize != uVar8)) {
        (*alloc->Free)(alloc,p->bufferBase);
        p->bufferBase = (Byte *)0x0;
        p->blockSize = uVar8;
        pBVar1 = (Byte *)(*alloc->Alloc)(alloc,(ulong)uVar8);
        p->bufferBase = pBVar1;
        if (pBVar1 == (Byte *)0x0) goto LAB_00114254;
      }
    }
    else {
      p->blockSize = uVar8;
    }
    p->matchMaxLen = matchMaxLen;
    p->fixedHashSize = 0;
    uVar8 = p->numHashBytes;
    if (uVar8 == 2) {
      p->hashMask = 0xffff;
      iVar5 = 0x10000;
      uVar9 = 0;
    }
    else {
      uVar6 = historySize - 1 >> 1 | historySize - 1;
      uVar6 = uVar6 >> 2 | uVar6;
      uVar6 = uVar6 >> 4 | uVar6;
      uVar9 = uVar6 >> 1 | uVar6 >> 9 | 0xffff;
      uVar6 = 0xffffff;
      if (uVar8 != 3) {
        uVar6 = uVar9 >> 1;
      }
      if (uVar9 < 0x1000001) {
        uVar6 = uVar9;
      }
      iVar5 = uVar6 + 1;
      uVar9 = 0;
      p->hashMask = uVar6;
      if (2 < uVar8) {
        p->fixedHashSize = 0x400;
        uVar9 = 0x400;
        if (uVar8 != 3) {
          uVar9 = (uint)(4 < uVar8) << 0x14 | 0x10400;
          p->fixedHashSize = uVar9;
        }
      }
    }
    p->historySize = historySize;
    p->hashSizeSum = uVar9 + iVar5;
    p->cyclicBufferSize = historySize + 1;
    sVar10 = (ulong)(uVar9 + iVar5) + ((ulong)(historySize + 1) << (p->btMode != '\0'));
    if ((p->hash != (CLzRef *)0x0) && (p->numRefs == sVar10)) {
      return 1;
    }
    (*alloc->Free)(alloc,p->hash);
    p->hash = (CLzRef *)0x0;
    p->numRefs = sVar10;
    pCVar2 = (CLzRef *)(*alloc->Alloc)(alloc,sVar10 * 4);
    p->hash = pCVar2;
    if (pCVar2 != (CLzRef *)0x0) {
      p->son = pCVar2 + p->hashSizeSum;
      return 1;
    }
    pCVar2 = (CLzRef *)0x0;
  }
  else {
LAB_00114254:
    pCVar2 = p->hash;
  }
  (*alloc->Free)(alloc,pCVar2);
  p->hash = (CLzRef *)0x0;
  if (p->directInput == '\0') {
    (*alloc->Free)(alloc,p->bufferBase);
    p->bufferBase = (Byte *)0x0;
  }
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder *p, UInt32 historySize,
    UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
    ISzAlloc *alloc)
{
  UInt32 sizeReserv;
  
  if (historySize > kMaxHistorySize)
  {
    MatchFinder_Free(p, alloc);
    return 0;
  }
  
  sizeReserv = historySize >> 1;
       if (historySize >= ((UInt32)3 << 30)) sizeReserv = historySize >> 3;
  else if (historySize >= ((UInt32)2 << 30)) sizeReserv = historySize >> 2;
  
  sizeReserv += (keepAddBufferBefore + matchMaxLen + keepAddBufferAfter) / 2 + (1 << 19);

  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;
  p->keepSizeAfter = matchMaxLen + keepAddBufferAfter;
  
  /* we need one additional byte, since we use MoveBlock after pos++ and before dictionary using */
  
  if (LzInWindow_Create(p, sizeReserv, alloc))
  {
    UInt32 newCyclicBufferSize = historySize + 1;
    UInt32 hs;
    p->matchMaxLen = matchMaxLen;
    {
      p->fixedHashSize = 0;
      if (p->numHashBytes == 2)
        hs = (1 << 16) - 1;
      else
      {
        hs = historySize - 1;
        hs |= (hs >> 1);
        hs |= (hs >> 2);
        hs |= (hs >> 4);
        hs |= (hs >> 8);
        hs >>= 1;
        hs |= 0xFFFF; /* don't change it! It's required for Deflate */
        if (hs > (1 << 24))
        {
          if (p->numHashBytes == 3)
            hs = (1 << 24) - 1;
          else
            hs >>= 1;
          /* if (bigHash) mode, GetHeads4b() in LzFindMt.c needs (hs >= ((1 << 24) - 1))) */
        }
      }
      p->hashMask = hs;
      hs++;
      if (p->numHashBytes > 2) p->fixedHashSize += kHash2Size;
      if (p->numHashBytes > 3) p->fixedHashSize += kHash3Size;
      if (p->numHashBytes > 4) p->fixedHashSize += kHash4Size;
      hs += p->fixedHashSize;
    }

    {
      size_t newSize;
      size_t numSons;
      p->historySize = historySize;
      p->hashSizeSum = hs;
      p->cyclicBufferSize = newCyclicBufferSize;
      
      numSons = newCyclicBufferSize;
      if (p->btMode)
        numSons <<= 1;
      newSize = hs + numSons;

      if (p->hash && p->numRefs == newSize)
        return 1;
      
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->numRefs = newSize;
      p->hash = AllocRefs(newSize, alloc);
      
      if (p->hash)
      {
        p->son = p->hash + p->hashSizeSum;
        return 1;
      }
    }
  }

  MatchFinder_Free(p, alloc);
  return 0;
}